

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safecrt.h
# Opt level: O3

errno_t strcpy_s<256ul>(char (*_Dst) [256],char *_Src)

{
  char cVar1;
  ulong uVar2;
  size_t __n;
  errno_t eVar3;
  bool bVar4;
  
  if (_Src == (char *)0x0) {
    (*_Dst)[0] = '\0';
    memset(*_Dst + 1,0xfd,0xff);
    RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
    eVar3 = 0x16;
  }
  else {
    uVar2 = 1;
    __n = 0xff;
    do {
      cVar1 = _Src[uVar2 - 1];
      _Dst[-1][uVar2 + 0xff] = cVar1;
      if (cVar1 == '\0') {
        if (0xff < uVar2) {
          return 0;
        }
        memset(*_Dst + uVar2,0xfd,__n);
        return 0;
      }
      uVar2 = uVar2 + 1;
      bVar4 = __n != 0;
      __n = __n - 1;
    } while (bVar4);
    (*_Dst)[0] = '\0';
    memset(*_Dst + 1,0xfd,0xff);
    RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
    eVar3 = 0x22;
  }
  return eVar3;
}

Assistant:

inline
errno_t __cdecl strcpy_s(char (&_Dst)[_SizeInBytes], const char *_Src)
{
    return strcpy_s(_Dst, _SizeInBytes, _Src);
}